

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_scheduler.cpp
# Opt level: O1

void __thiscall
async::detail::threadpool_data::threadpool_data
          (threadpool_data *this,size_t num_threads,function<void_()> *prerun_,
          function<void_()> *postrun_)

{
  undefined8 uVar1;
  void **ppvVar2;
  task_wait_event **pptVar3;
  
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  aligned_array<async::detail::thread_data_t,_64UL>::aligned_array(&this->thread_data,num_threads);
  (this->public_queue).items.length = 0x20;
  ppvVar2 = (void **)aligned_alloc(0x100,0x40);
  (this->public_queue).items.ptr = ppvVar2;
  (this->num_waiters).super___atomic_base<unsigned_long>._M_i = 0;
  (this->public_queue).head = 0;
  (this->public_queue).tail = 0;
  this->shutdown = false;
  pptVar3 = (task_wait_event **)
            operator_new__(-(ulong)(num_threads >> 0x3d != 0) | num_threads << 3);
  (this->waiters)._M_t.
  super___uniq_ptr_impl<async::detail::task_wait_event_*,_std::default_delete<async::detail::task_wait_event_*[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_async::detail::task_wait_event_**,_std::default_delete<async::detail::task_wait_event_*[]>_>
  .super__Head_base<0UL,_async::detail::task_wait_event_**,_false>._M_head_impl = pptVar3;
  *(undefined8 *)&(this->prerun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->prerun).super__Function_base._M_functor + 8) = 0;
  (this->prerun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->prerun)._M_invoker = prerun_->_M_invoker;
  if ((prerun_->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(prerun_->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->prerun).super__Function_base._M_functor =
         *(undefined8 *)&(prerun_->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->prerun).super__Function_base._M_functor + 8) = uVar1;
    (this->prerun).super__Function_base._M_manager = (prerun_->super__Function_base)._M_manager;
    (prerun_->super__Function_base)._M_manager = (_Manager_type)0x0;
    prerun_->_M_invoker = (_Invoker_type)0x0;
  }
  *(undefined8 *)&(this->postrun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->postrun).super__Function_base._M_functor + 8) = 0;
  (this->postrun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->postrun)._M_invoker = postrun_->_M_invoker;
  if ((postrun_->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(postrun_->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->postrun).super__Function_base._M_functor =
         *(undefined8 *)&(postrun_->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->postrun).super__Function_base._M_functor + 8) = uVar1;
    (this->postrun).super__Function_base._M_manager = (postrun_->super__Function_base)._M_manager;
    (postrun_->super__Function_base)._M_manager = (_Manager_type)0x0;
    postrun_->_M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

threadpool_data(std::size_t num_threads, std::function<void()>&& prerun_, std::function<void()>&& postrun_)
		: thread_data(num_threads), shutdown(false), num_waiters(0), waiters(new task_wait_event*[num_threads]),
          prerun(std::move(prerun_)), postrun(std::move(postrun_)) {}